

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.hpp
# Opt level: O2

void __thiscall Executor::Executor(Executor *this)

{
  (this->super_Visitor)._vptr_Visitor = (_func_int **)&PTR__Executor_00149338;
  (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
  super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.super__Head_base<0UL,_Value_*,_false>
  ._M_head_impl = (Value *)0x0;
  Context::Context(&this->context_);
  std::
  stack<std::unique_ptr<Value,std::default_delete<Value>>,std::deque<std::unique_ptr<Value,std::default_delete<Value>>,std::allocator<std::unique_ptr<Value,std::default_delete<Value>>>>>
  ::
  stack<std::deque<std::unique_ptr<Value,std::default_delete<Value>>,std::allocator<std::unique_ptr<Value,std::default_delete<Value>>>>,void>
            (&this->returnStack_);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->stdout_);
  this->exitCode_ = 0;
  return;
}

Assistant:

Executor(): value_(), context_(), returnStack_(), stdout_(), exitCode_(0) {}